

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::writeVectorConstructor<3>
               (ostream *str,Vector<float,_3> *v)

{
  ostream *poVar1;
  Vector<float,_3> *pVVar2;
  int precision;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  long lVar4;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"vec",3);
  poVar1 = (ostream *)std::ostream::operator<<(str,3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  lVar4 = 0;
  uVar3 = extraout_RDX;
  do {
    precision = (int)uVar3;
    pVVar2 = v;
    if (lVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      pVVar2 = (Vector<float,_3> *)((long)v->m_data + lVar4);
      precision = extraout_EDX;
    }
    de::floatToString_abi_cxx11_(&local_50,(de *)&DAT_00000001,pVVar2->m_data[0],precision);
    std::__ostream_insert<char,std::char_traits<char>>
              (str,local_50._M_dataplus._M_p,local_50._M_string_length);
    uVar3 = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      uVar3 = extraout_RDX_01;
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  std::__ostream_insert<char,std::char_traits<char>>(str,")",1);
  return;
}

Assistant:

void writeVectorConstructor (std::ostream& str, const tcu::Vector<float, Size>& v)
{
	str << "vec" << Size << "(";
	for (int ndx = 0; ndx < Size; ndx++)
	{
		if (ndx != 0)
			str << ", ";
		str << de::floatToString(v[ndx], 1);
	}
	str << ")";
}